

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::FixFuncCallArgumentsPass::ReplaceAccessChainFuncCallArguments
          (FixFuncCallArgumentsPass *this,Instruction *func_call_inst,Instruction *operand_inst)

{
  IRContext *this_00;
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  TypeManager *this_01;
  iterator iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  BasicBlock *pBVar6;
  Instruction *pIVar7;
  Instruction *this_02;
  Instruction *this_03;
  uint32_t type_id;
  uint uVar8;
  InstructionBuilder builder;
  uint32_t local_64;
  InstructionBuilder local_60;
  iterator local_40;
  iterator local_38;
  
  this_00 = (this->super_Pass).context_;
  local_60.parent_ = IRContext::get_instr_block(this_00,func_call_inst);
  local_60.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  pIVar7 = (func_call_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  uVar4 = 0;
  local_38.node_ = (Instruction *)0x0;
  if ((pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
    local_38.node_ = pIVar7;
  }
  local_60.context_ = this_00;
  local_60.insert_before_.super_iterator.node_ = (iterator)(iterator)func_call_inst;
  pBVar6 = IRContext::get_instr_block((this->super_Pass).context_,func_call_inst);
  local_40.node_ =
       *(Instruction **)
        ((long)(((pBVar6->function_->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        + 0x20);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if (operand_inst->has_type_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(operand_inst,0);
  }
  pIVar7 = analysis::DefUseManager::GetDef(pDVar2,uVar4);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar8 = (pIVar7->has_result_id_ & 1) + 1;
  if (pIVar7->has_type_id_ == false) {
    uVar8 = (uint)pIVar7->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(pIVar7,uVar8 + 1);
  pIVar7 = analysis::DefUseManager::GetDef(pDVar2,uVar4);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  this_01 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  local_64 = 0;
  uVar4 = 0;
  if (pIVar7->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  uVar4 = analysis::TypeManager::FindPointerToType(this_01,uVar4,Function);
  iVar3.node_ = local_40.node_;
  local_60.parent_ = IRContext::get_instr_block(this_00,local_40.node_);
  local_60.insert_before_.super_iterator.node_ = (iterator)(iterator)iVar3.node_;
  this_02 = InstructionBuilder::AddVariable(&local_60,uVar4,7);
  local_60.parent_ = IRContext::get_instr_block(local_60.context_,func_call_inst);
  local_60.insert_before_.super_iterator.node_ = (iterator)(iterator)func_call_inst;
  if (operand_inst->has_result_id_ == true) {
    local_64 = Instruction::GetSingleWordOperand(operand_inst,(uint)operand_inst->has_type_id_);
  }
  uVar5 = 0;
  uVar4 = 0;
  if (pIVar7->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  this_03 = InstructionBuilder::AddLoad(&local_60,uVar4,local_64,0);
  if (this_02->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
  }
  type_id = 0;
  uVar4 = 0;
  if (this_03->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(this_03,(uint)this_03->has_type_id_);
  }
  InstructionBuilder::AddStore(&local_60,uVar5,uVar4);
  iVar3.node_ = local_38.node_;
  local_60.parent_ = IRContext::get_instr_block(local_60.context_,local_38.node_);
  local_60.insert_before_.super_iterator.node_ = (iterator)(iterator)iVar3.node_;
  if (pIVar7->has_result_id_ == true) {
    type_id = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  uVar5 = 0;
  uVar4 = 0;
  if (this_02->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
  }
  pIVar7 = InstructionBuilder::AddLoad(&local_60,type_id,uVar4,0);
  if (pIVar7->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
  }
  InstructionBuilder::AddStore(&local_60,local_64,uVar5);
  uVar4 = 0;
  if (this_02->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
  }
  return uVar4;
}

Assistant:

uint32_t FixFuncCallArgumentsPass::ReplaceAccessChainFuncCallArguments(
    Instruction* func_call_inst, Instruction* operand_inst) {
  InstructionBuilder builder(
      context(), func_call_inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  Instruction* next_insert_point = func_call_inst->NextNode();
  // Get Variable insertion point
  Function* func = context()->get_instr_block(func_call_inst)->GetParent();
  Instruction* variable_insertion_point = &*(func->begin()->begin());
  Instruction* op_ptr_type = get_def_use_mgr()->GetDef(operand_inst->type_id());
  Instruction* op_type =
      get_def_use_mgr()->GetDef(op_ptr_type->GetSingleWordInOperand(1));
  uint32_t varType = context()->get_type_mgr()->FindPointerToType(
      op_type->result_id(), spv::StorageClass::Function);
  // Create new variable
  builder.SetInsertPoint(variable_insertion_point);
  Instruction* var =
      builder.AddVariable(varType, uint32_t(spv::StorageClass::Function));
  // Load access chain to the new variable before function call
  builder.SetInsertPoint(func_call_inst);

  uint32_t operand_id = operand_inst->result_id();
  Instruction* load = builder.AddLoad(op_type->result_id(), operand_id);
  builder.AddStore(var->result_id(), load->result_id());
  // Load return value to the acesschain after function call
  builder.SetInsertPoint(next_insert_point);
  load = builder.AddLoad(op_type->result_id(), var->result_id());
  builder.AddStore(operand_id, load->result_id());

  return var->result_id();
}